

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestRequiredOneof::_InternalSerialize
          (TestRequiredOneof *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  TestRequiredOneof_NestedMessage *pTVar1;
  string_view s;
  TestRequiredOneof *pTVar2;
  bool bVar3;
  FooCase FVar4;
  int32_t value;
  int iVar5;
  char *data;
  UnknownFieldSet *unknown_fields;
  string_view local_48;
  string *local_38;
  string *_s;
  TestRequiredOneof *pTStack_28;
  uint32_t cached_has_bits;
  TestRequiredOneof *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestRequiredOneof *this_local;
  
  _s._4_4_ = 0;
  pTStack_28 = this;
  this_ = (TestRequiredOneof *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  FVar4 = foo_case(this);
  pTVar2 = this_;
  switch(FVar4) {
  case kFooInt:
    value = _internal_foo_int(pTStack_28);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                             ((EpsCopyOutputStream *)pTVar2,value,(uint8_t *)stream_local);
    break;
  case kFooString:
    local_38 = _internal_foo_string_abi_cxx11_(pTStack_28);
    data = (char *)std::__cxx11::string::data();
    iVar5 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"proto2_unittest.TestRequiredOneof.foo_string");
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (data,iVar5,SERIALIZE,local_48);
    pTVar2 = this_;
    s = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pTVar2,2,s,(uint8_t *)stream_local);
    break;
  case kFooMessage:
    pTVar1 = (pTStack_28->field_0)._impl_.foo_.foo_message_;
    iVar5 = TestRequiredOneof_NestedMessage::GetCachedSize
                      ((pTStack_28->field_0)._impl_.foo_.foo_message_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (3,(MessageLite *)pTVar1,iVar5,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
    break;
  case kFooLazyMessage:
    pTVar1 = (pTStack_28->field_0)._impl_.foo_.foo_message_;
    iVar5 = TestRequiredOneof_NestedMessage::GetCachedSize
                      ((pTStack_28->field_0)._impl_.foo_.foo_message_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (4,(MessageLite *)pTVar1,iVar5,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  bVar3 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(pTStack_28->super_Message).super_MessageLite._internal_metadata_);
  if (bVar3) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pTStack_28->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestRequiredOneof::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestRequiredOneof& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestRequiredOneof)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  switch (this_.foo_case()) {
    case kFooInt: {
      target =
          ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
              stream, this_._internal_foo_int(), target);
      break;
    }
    case kFooString: {
      const ::std::string& _s = this_._internal_foo_string();
      ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                  "proto2_unittest.TestRequiredOneof.foo_string");
      target = stream->WriteStringMaybeAliased(2, _s, target);
      break;
    }
    case kFooMessage: {
      target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
          3, *this_._impl_.foo_.foo_message_, this_._impl_.foo_.foo_message_->GetCachedSize(), target,
          stream);
      break;
    }
    case kFooLazyMessage: {
      target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
          4, *this_._impl_.foo_.foo_lazy_message_, this_._impl_.foo_.foo_lazy_message_->GetCachedSize(), target,
          stream);
      break;
    }
    default:
      break;
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestRequiredOneof)
  return target;
}